

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O2

void __thiscall TypeChecker::visit(TypeChecker *this,FunctionCallNode *node)

{
  optional<std::reference_wrapper<Symbol>_> oVar1;
  string name;
  FunctionAnalyser analyser;
  string local_60;
  FunctionAnalyser local_40;
  
  std::__cxx11::string::string((string *)&local_60,(string *)&node->name_);
  oVar1 = SymbolTable::lookup(this->symbols_,&local_60,0);
  if (((undefined1  [16])
       oVar1.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    FunctionAnalyser::FunctionAnalyser(&local_40);
    (**(code **)(*(long *)oVar1.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>.
                          _M_payload.super__Optional_payload_base<std::reference_wrapper<Symbol>_>.
                          _M_payload + 0x10))
              (oVar1.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
               super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload,&local_40);
    (this->type_).super__Optional_base<TypeName,_true,_true>._M_payload.
    super__Optional_payload_base<TypeName> =
         (_Optional_payload_base<TypeName>)
         local_40.returnType_.super__Optional_base<TypeName,_true,_true>._M_payload.
         super__Optional_payload_base<TypeName>;
    FunctionAnalyser::~FunctionAnalyser(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    return;
  }
  std::__throw_bad_optional_access();
}

Assistant:

void TypeChecker::visit(const FunctionCallNode& node)
{
  auto name = node.getName();
  auto& symbol = symbols_.lookup(name).value().get();
  FunctionAnalyser analyser{};
  symbol.accept(analyser);
  type_ = analyser.getReturnType();
}